

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

void __thiscall
Centaurus::LookaheadDFA<char>::filter_nodes
          (LookaheadDFA<char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> *this_00;
  pointer pNVar1;
  const_reference cVar2;
  LDFAState<char> *n;
  reference pvVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer pNVar7;
  ulong __n;
  NFATransition<char> *t;
  int local_8c;
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> nodes;
  vector<int,_std::allocator<int>_> index_map;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> filtered;
  
  nodes.super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodes.super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&index_map,
             ((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x50,(allocator_type *)&filtered);
  pLVar5 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar6 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)pLVar5 - (long)pLVar6) / 0x50 ==
      (ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    this_00 = &(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states;
    local_8c = 0;
    for (__n = 0; pLVar4 = nodes.
                           super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
        __n < (ulong)(((long)pLVar5 - (long)pLVar6) / 0x50); __n = __n + 1) {
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
      if (cVar2) {
        filtered.
        super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        filtered.
        super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        filtered.
        super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pvVar3 = std::
                 vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
                 at(this_00,__n);
        pNVar1 = (pvVar3->
                 super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                 ).m_transitions.
                 super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pNVar7 = (pvVar3->
                      super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                      ).m_transitions.
                      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pNVar7 != pNVar1;
            pNVar7 = pNVar7 + 1) {
          if (((long)pNVar7->m_dest < 0) ||
             (cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (mask,(long)pNVar7->m_dest), cVar2)) {
            std::
            vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
            ::push_back(&filtered,pNVar7);
          }
        }
        pvVar3 = std::
                 vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
                 at(this_00,__n);
        std::vector<Centaurus::LDFAState<char>,std::allocator<Centaurus::LDFAState<char>>>::
        emplace_back<Centaurus::LDFAState<char>&,std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>>
                  ((vector<Centaurus::LDFAState<char>,std::allocator<Centaurus::LDFAState<char>>> *)
                   &nodes,pvVar3,&filtered);
        index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[__n] = local_8c;
        local_8c = local_8c + 1;
        std::
        vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
        ~vector(&filtered);
      }
      else {
        index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[__n] = -1;
      }
      pLVar6 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar5 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pLVar4 != nodes.
                     super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pLVar4 = pLVar4 + 1) {
      pNVar1 = (pLVar4->
               super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
               ).m_transitions.
               super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pNVar7 = (pLVar4->
                    super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                    ).m_transitions.
                    super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pNVar7 != pNVar1; pNVar7 = pNVar7 + 1
          ) {
        if (-1 < (long)pNVar7->m_dest) {
          pNVar7->m_dest =
               index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[pNVar7->m_dest];
        }
      }
    }
    std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
    _M_move_assign(this_00,&nodes);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&index_map.super__Vector_base<int,_std::allocator<int>_>);
    std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::~vector
              (&nodes);
    return;
  }
  __assert_fail("m_states.size() == mask.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/LookaheadDFA.hpp"
                ,0x12e,
                "void Centaurus::LookaheadDFA<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
               );
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<LDFAState<TCHAR> > nodes;
        std::vector<int> index_map(m_states.size());

        assert(m_states.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_states.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<LDFATransition<TCHAR> > filtered;
                for (const auto& t : m_states.at(src_index).get_transitions())
                {
                    if (t.dest() < 0)
                    {
                        filtered.push_back(t);
                    }
                    else if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.emplace_back(m_states.at(src_index), std::move(filtered));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                if (t.dest() >= 0)
                    t.dest(index_map[t.dest()]);
            }
        }
        m_states = std::move(nodes);
    }